

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QREncoder.cpp
# Opt level: O1

Version * ZXing::QRCode::RecommendVersion
                    (ErrorCorrectionLevel ecLevel,CodecMode mode,BitArray *headerBits,
                    BitArray *dataBits)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Version *pVVar4;
  
  pVVar4 = Version::Model2(1);
  iVar1 = *(int *)&(headerBits->_bits).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  iVar2 = *(int *)&(headerBits->_bits).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  iVar3 = CharacterCountBits(mode,pVVar4);
  pVVar4 = ChooseVersion((*(int *)&(dataBits->_bits).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                         *(int *)&(dataBits->_bits).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start) +
                         (iVar1 - iVar2) + iVar3,ecLevel);
  iVar1 = *(int *)&(headerBits->_bits).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  iVar2 = *(int *)&(headerBits->_bits).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  iVar3 = CharacterCountBits(mode,pVVar4);
  pVVar4 = ChooseVersion((*(int *)&(dataBits->_bits).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                         *(int *)&(dataBits->_bits).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start) + (iVar1 - iVar2) +
                         iVar3,ecLevel);
  return pVVar4;
}

Assistant:

static const Version& RecommendVersion(ErrorCorrectionLevel ecLevel, CodecMode mode, const BitArray& headerBits, const BitArray& dataBits)
{
	// Hard part: need to know version to know how many bits length takes. But need to know how many
	// bits it takes to know version. First we take a guess at version by assuming version will be
	// the minimum, 1:
	int provisionalBitsNeeded = CalculateBitsNeeded(mode, headerBits, dataBits, *Version::Model2(1));
	const Version& provisionalVersion = ChooseVersion(provisionalBitsNeeded, ecLevel);

	// Use that guess to calculate the right version. I am still not sure this works in 100% of cases.
	int bitsNeeded = CalculateBitsNeeded(mode, headerBits, dataBits, provisionalVersion);
	return ChooseVersion(bitsNeeded, ecLevel);
}